

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall Assimp::ASEImporter::ConvertMaterial(ASEImporter *this,Material *mat)

{
  float fVar1;
  ulong uVar2;
  aiMaterial *this_00;
  aiShadingMode eShading;
  int i;
  aiString name;
  undefined4 local_834;
  aiString local_830;
  aiString local_42c;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  mat->pcInstance = this_00;
  (mat->super_Material).mAmbient.r =
       (this->mParser->m_clrAmbient).r + (mat->super_Material).mAmbient.r;
  (mat->super_Material).mAmbient.g =
       (this->mParser->m_clrAmbient).g + (mat->super_Material).mAmbient.g;
  (mat->super_Material).mAmbient.b =
       (this->mParser->m_clrAmbient).b + (mat->super_Material).mAmbient.b;
  local_42c.length = 0;
  local_42c.data[0] = '\0';
  memset(local_42c.data + 1,0x1b,0x3ff);
  uVar2 = (mat->super_Material).mName._M_string_length;
  if (uVar2 < 0x400) {
    local_42c.length = (ai_uint32)uVar2;
    memcpy(local_42c.data,(mat->super_Material).mName._M_dataplus._M_p,uVar2);
    local_42c.data[uVar2] = '\0';
  }
  aiMaterial::AddProperty(this_00,&local_42c,"?mat.name",0,0);
  aiMaterial::AddBinaryProperty
            (mat->pcInstance,&(mat->super_Material).mAmbient,0xc,"$clr.ambient",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty
            (mat->pcInstance,&(mat->super_Material).mDiffuse,0xc,"$clr.diffuse",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty
            (mat->pcInstance,&(mat->super_Material).mSpecular,0xc,"$clr.specular",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty
            (mat->pcInstance,&(mat->super_Material).mEmissive,0xc,"$clr.emissive",0,0,aiPTI_Float);
  fVar1 = (mat->super_Material).mSpecularExponent;
  if (((fVar1 == 0.0) && (!NAN(fVar1))) ||
     ((fVar1 = (mat->super_Material).mShininessStrength, fVar1 == 0.0 && (!NAN(fVar1))))) {
    if ((mat->super_Material).mShading - Phong < 3) {
      (mat->super_Material).mShading = Gouraud;
    }
  }
  else {
    aiMaterial::AddBinaryProperty
              (mat->pcInstance,&(mat->super_Material).mSpecularExponent,4,"$mat.shininess",0,0,
               aiPTI_Float);
    aiMaterial::AddBinaryProperty
              (mat->pcInstance,&(mat->super_Material).mShininessStrength,4,"$mat.shinpercent",0,0,
               aiPTI_Float);
  }
  aiMaterial::AddBinaryProperty
            (mat->pcInstance,&(mat->super_Material).mTransparency,4,"$mat.opacity",0,0,aiPTI_Float);
  if ((mat->super_Material).mTwoSided == true) {
    local_830.length = 1;
    aiMaterial::AddBinaryProperty(mat->pcInstance,&local_830,4,"$mat.twosided",0,0,aiPTI_Integer);
  }
  local_834 = 9;
  switch((mat->super_Material).mShading) {
  case Wire:
    local_830.length = 1;
    aiMaterial::AddBinaryProperty(mat->pcInstance,&local_830,4,"$mat.wireframe",0,0,aiPTI_Integer);
  case Gouraud:
    local_834 = 2;
    break;
  case Flat:
    local_834 = 1;
    break;
  case Phong:
    local_834 = 3;
    break;
  case Metal:
    local_834 = 8;
    break;
  case Blinn:
    local_834 = 4;
  }
  aiMaterial::AddBinaryProperty(mat->pcInstance,&local_834,4,"$mat.shadingm",0,0,aiPTI_Integer);
  if ((mat->super_Material).sTexDiffuse.mMapName._M_string_length != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexDiffuse,aiTextureType_DIFFUSE);
  }
  if ((mat->super_Material).sTexSpecular.mMapName._M_string_length != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexSpecular,aiTextureType_SPECULAR);
  }
  if ((mat->super_Material).sTexAmbient.mMapName._M_string_length != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexAmbient,aiTextureType_AMBIENT);
  }
  if ((mat->super_Material).sTexOpacity.mMapName._M_string_length != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexOpacity,aiTextureType_OPACITY);
  }
  if ((mat->super_Material).sTexEmissive.mMapName._M_string_length != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexEmissive,aiTextureType_EMISSIVE);
  }
  if ((mat->super_Material).sTexBump.mMapName._M_string_length != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexBump,aiTextureType_HEIGHT);
  }
  if ((mat->super_Material).sTexShininess.mMapName._M_string_length != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexShininess,aiTextureType_SHININESS);
  }
  uVar2 = (mat->super_Material).mName._M_string_length;
  if (uVar2 != 0) {
    local_830.length = 0;
    local_830.data[0] = '\0';
    memset(local_830.data + 1,0x1b,0x3ff);
    if (uVar2 < 0x400) {
      local_830.length = (ai_uint32)uVar2;
      memcpy(local_830.data,(mat->super_Material).mName._M_dataplus._M_p,uVar2);
      local_830.data[uVar2] = '\0';
    }
    aiMaterial::AddProperty(mat->pcInstance,&local_830,"?mat.name",0,0);
  }
  return;
}

Assistant:

void ASEImporter::ConvertMaterial(ASE::Material& mat)
{
    // LARGE TODO: Much code her is copied from 3DS ... join them maybe?

    // Allocate the output material
    mat.pcInstance = new aiMaterial();

    // At first add the base ambient color of the
    // scene to the material
    mat.mAmbient.r += mParser->m_clrAmbient.r;
    mat.mAmbient.g += mParser->m_clrAmbient.g;
    mat.mAmbient.b += mParser->m_clrAmbient.b;

    aiString name;
    name.Set( mat.mName);
    mat.pcInstance->AddProperty( &name, AI_MATKEY_NAME);

    // material colors
    mat.pcInstance->AddProperty( &mat.mAmbient, 1, AI_MATKEY_COLOR_AMBIENT);
    mat.pcInstance->AddProperty( &mat.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
    mat.pcInstance->AddProperty( &mat.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
    mat.pcInstance->AddProperty( &mat.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);

    // shininess
    if (0.0f != mat.mSpecularExponent && 0.0f != mat.mShininessStrength)
    {
        mat.pcInstance->AddProperty( &mat.mSpecularExponent, 1, AI_MATKEY_SHININESS);
        mat.pcInstance->AddProperty( &mat.mShininessStrength, 1, AI_MATKEY_SHININESS_STRENGTH);
    }
    // If there is no shininess, we can disable phong lighting
    else if (D3DS::Discreet3DS::Metal == mat.mShading ||
        D3DS::Discreet3DS::Phong == mat.mShading ||
        D3DS::Discreet3DS::Blinn == mat.mShading)
    {
        mat.mShading = D3DS::Discreet3DS::Gouraud;
    }

    // opacity
    mat.pcInstance->AddProperty<ai_real>( &mat.mTransparency,1,AI_MATKEY_OPACITY);

    // Two sided rendering?
    if (mat.mTwoSided)
    {
        int i = 1;
        mat.pcInstance->AddProperty<int>(&i,1,AI_MATKEY_TWOSIDED);
    }

    // shading mode
    aiShadingMode eShading = aiShadingMode_NoShading;
    switch (mat.mShading)
    {
        case D3DS::Discreet3DS::Flat:
            eShading = aiShadingMode_Flat; break;
        case D3DS::Discreet3DS::Phong :
            eShading = aiShadingMode_Phong; break;
        case D3DS::Discreet3DS::Blinn :
            eShading = aiShadingMode_Blinn; break;

            // I don't know what "Wire" shading should be,
            // assume it is simple lambertian diffuse (L dot N) shading
        case D3DS::Discreet3DS::Wire:
            {
                // set the wireframe flag
                unsigned int iWire = 1;
                mat.pcInstance->AddProperty<int>( (int*)&iWire,1,AI_MATKEY_ENABLE_WIREFRAME);
            }
        case D3DS::Discreet3DS::Gouraud:
            eShading = aiShadingMode_Gouraud; break;
        case D3DS::Discreet3DS::Metal :
            eShading = aiShadingMode_CookTorrance; break;
    }
    mat.pcInstance->AddProperty<int>( (int*)&eShading,1,AI_MATKEY_SHADING_MODEL);

    // DIFFUSE texture
    if( mat.sTexDiffuse.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexDiffuse, aiTextureType_DIFFUSE);

    // SPECULAR texture
    if( mat.sTexSpecular.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexSpecular, aiTextureType_SPECULAR);

    // AMBIENT texture
    if( mat.sTexAmbient.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexAmbient, aiTextureType_AMBIENT);

    // OPACITY texture
    if( mat.sTexOpacity.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexOpacity, aiTextureType_OPACITY);

    // EMISSIVE texture
    if( mat.sTexEmissive.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexEmissive, aiTextureType_EMISSIVE);

    // BUMP texture
    if( mat.sTexBump.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexBump, aiTextureType_HEIGHT);

    // SHININESS texture
    if( mat.sTexShininess.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexShininess, aiTextureType_SHININESS);

    // store the name of the material itself, too
    if( mat.mName.length() > 0) {
        aiString tex;tex.Set( mat.mName);
        mat.pcInstance->AddProperty( &tex, AI_MATKEY_NAME);
    }
    return;
}